

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int JS_GetOwnPropertyNamesInternal
              (JSContext *ctx,JSPropertyEnum **ptab,uint32_t *plen,JSObject *p,int flags)

{
  uint v;
  int iVar1;
  JSShape *pJVar2;
  JSAtomStruct *pJVar3;
  JSClassExoticMethods *pJVar4;
  _func_int_JSContext_ptr_JSPropertyEnum_ptr_ptr_uint32_t_ptr_JSValue *p_Var5;
  JSContext *ctx_00;
  uint uVar6;
  JSAtomKindEnum JVar7;
  BOOL BVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  JSAtom JVar12;
  uint32_t uVar13;
  uint uVar14;
  ulong uVar15;
  JSValueUnion JVar16;
  long lVar17;
  bool bVar18;
  JSValue JVar19;
  uint32_t exotic_count;
  JSObject *p_1;
  JSPropertyEnum *tab_exotic;
  uint32_t num_key;
  JSPropertyDescriptor desc;
  ulong local_c0;
  uint local_b8;
  uint32_t local_b4;
  ulong local_b0;
  JSContext *local_a8;
  JSValueUnion local_a0;
  JSPropertyEnum *local_98;
  ulong local_90;
  JSPropertyEnum *local_88;
  int local_80;
  uint32_t local_7c;
  JSPropertyEnum **local_78;
  uint32_t *local_70;
  JSPropertyDescriptor local_68;
  
  *ptab = (JSPropertyEnum *)0x0;
  *plen = 0;
  local_b4 = 0;
  local_98 = (JSPropertyEnum *)0x0;
  pJVar2 = p->shape;
  iVar1 = 0;
  local_b0 = 0;
  local_b8 = 0;
  local_a8 = ctx;
  local_a0 = (JSValueUnion)p;
  local_78 = ptab;
  local_70 = plen;
  if (0 < pJVar2->prop_count) {
    lVar17 = 0;
    local_b8 = 0;
    local_b0 = 0;
    iVar1 = 0;
    do {
      JVar12 = *(JSAtom *)(&pJVar2[1].header.field_0x4 + lVar17 * 8);
      if (JVar12 != 0) {
        uVar9 = (&pJVar2[1].header.ref_count)[lVar17 * 2];
        JVar7 = JS_AtomGetKind((JSContext *)ctx->rt,JVar12);
        ctx = local_a8;
        if ((((flags & 0x10U) == 0) || ((uVar9 & 0x10000000) != 0)) &&
           (((uint)flags >> (JVar7 & 0x1f) & 1) != 0)) {
          BVar8 = JS_AtomIsArrayIndex(local_a8,&local_7c,JVar12);
          ctx = local_a8;
          if (BVar8 == 0) {
            if (JVar7 == JS_ATOM_KIND_STRING) {
              local_b0 = (ulong)((int)local_b0 + 1);
            }
            else {
              iVar1 = iVar1 + 1;
            }
          }
          else {
            local_b8 = local_b8 + 1;
          }
        }
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 < pJVar2->prop_count);
  }
  JVar16 = local_a0;
  if ((*(byte *)((long)local_a0.ptr + 5) & 4) == 0) {
    iVar11 = 0;
  }
  else {
    iVar11 = 0;
    if ((*(byte *)((long)local_a0.ptr + 5) & 8) == 0) {
      if ((ulong)*(ushort *)((long)local_a0.ptr + 6) == 5) {
        if ((flags & 1U) != 0) {
          iVar11 = 0;
          uVar9 = 0;
          if (*(int *)((long)local_a0.ptr + 0x38) == -7) {
            uVar9 = *(uint *)&(((anon_union_24_22_bbf4f0e3_for_u *)((long)local_a0.ptr + 0x30))->
                               async_function_data->header).field_0x4 & 0x7fffffff;
          }
          local_b8 = local_b8 + uVar9;
        }
      }
      else {
        pJVar4 = ctx->rt->class_array[*(ushort *)((long)local_a0.ptr + 6)].exotic;
        if ((pJVar4 != (JSClassExoticMethods *)0x0) &&
           (p_Var5 = pJVar4->get_own_property_names,
           p_Var5 != (_func_int_JSContext_ptr_JSPropertyEnum_ptr_ptr_uint32_t_ptr_JSValue *)0x0)) {
          JVar19.tag = -1;
          JVar19.u.ptr = local_a0.ptr;
          iVar10 = (*p_Var5)(ctx,&local_98,&local_b4,JVar19);
          if (iVar10 != 0) {
            return -1;
          }
          if (local_b4 != 0) {
            uVar15 = 0;
            local_90 = 0;
            do {
              JVar12 = local_98[uVar15].atom;
              JVar7 = JS_AtomGetKind((JSContext *)ctx->rt,JVar12);
              if (((uint)flags >> (JVar7 & 0x1f) & 1) != 0) {
                if ((flags & 0x30U) == 0) {
                  uVar9 = 0;
                }
                else {
                  iVar11 = JS_GetOwnPropertyInternal(ctx,&local_68,(JSObject *)local_a0.ptr,JVar12);
                  if (iVar11 < 0) {
                    js_free_prop_enum(ctx,local_98,local_b4);
                    return -1;
                  }
                  if (iVar11 == 0) {
                    uVar9 = 0;
                  }
                  else {
                    uVar9 = (uint)local_68.flags >> 2 & 1;
                    js_free_desc(ctx,&local_68);
                  }
                  local_98[uVar15].is_enumerable = uVar9;
                }
                local_90 = (ulong)((int)local_90 + (uint)(byte)((flags & 0x10U) == 0 | (byte)uVar9))
                ;
              }
              uVar15 = uVar15 + 1;
            } while (uVar15 < local_b4);
            iVar11 = (int)local_90;
            JVar16 = local_a0;
          }
        }
      }
    }
    else {
      iVar11 = 0;
      if ((flags & 1U) != 0) {
        local_b8 = local_b8 + *(int *)((long)local_a0.ptr + 0x40);
      }
    }
  }
  uVar9 = (int)local_b0 + local_b8;
  local_b0 = (ulong)uVar9;
  uVar13 = iVar11 + iVar1 + uVar9;
  uVar15 = 1;
  if (1 < (int)uVar13) {
    uVar15 = (ulong)uVar13;
  }
  local_88 = (JSPropertyEnum *)js_malloc(ctx,uVar15 << 3);
  if (local_88 == (JSPropertyEnum *)0x0) {
    js_free_prop_enum(ctx,local_98,local_b4);
    return -1;
  }
  pJVar2 = *(JSShape **)((long)JVar16.ptr + 0x18);
  if (pJVar2->prop_count < 1) {
    bVar18 = true;
    local_c0 = 0;
  }
  else {
    lVar17 = 0;
    local_80 = 1;
    local_c0 = 0;
    uVar9 = local_b8;
    local_90 = (ulong)uVar13;
    do {
      v = *(uint *)(&pJVar2[1].header.field_0x4 + lVar17 * 8);
      if ((ulong)v != 0) {
        uVar14 = (&pJVar2[1].header.ref_count)[lVar17 * 2] & 0x10000000;
        JVar7 = JS_AtomGetKind((JSContext *)local_a8->rt,v);
        if ((((flags & 0x10U) == 0) || (uVar14 != 0)) && (((uint)flags >> (JVar7 & 0x1f) & 1) != 0))
        {
          BVar8 = JS_AtomIsArrayIndex(local_a8,&local_7c,v);
          uVar6 = uVar9;
          if (BVar8 == 0) {
            uVar15 = local_c0;
            if (JVar7 == JS_ATOM_KIND_STRING) {
              uVar6 = uVar9 + 1;
              local_c0._0_4_ = uVar9;
            }
            else {
              local_c0._0_4_ = (uint)local_b0;
              local_b0 = (ulong)((uint)local_c0 + 1);
            }
          }
          else {
            local_80 = 0;
            uVar15 = (ulong)((uint)local_c0 + 1);
          }
          uVar9 = uVar6;
          if (0xd1 < (int)v) {
            pJVar3 = local_a8->rt->atom_array[v];
            (pJVar3->header).ref_count = (pJVar3->header).ref_count + 1;
          }
          local_88[(int)(uint)local_c0].atom = v;
          local_88[(int)(uint)local_c0].is_enumerable = uVar14 >> 0x1c;
          local_b0 = local_b0 & 0xffffffff;
          local_c0 = uVar15;
        }
      }
      lVar17 = lVar17 + 1;
    } while ((int)lVar17 < pJVar2->prop_count);
    bVar18 = local_80 != 0;
    uVar13 = (uint32_t)local_90;
    JVar16 = local_a0;
  }
  ctx_00 = local_a8;
  if ((*(byte *)((long)JVar16.ptr + 5) & 4) == 0) goto LAB_0011d95d;
  if ((*(byte *)((long)JVar16.ptr + 5) & 8) == 0) {
    if (*(short *)((long)local_a0.ptr + 6) != 5) {
      if (local_b4 != 0) {
        uVar15 = 0;
        do {
          iVar1 = local_98[uVar15].is_enumerable;
          JVar12 = local_98[uVar15].atom;
          JVar7 = JS_AtomGetKind((JSContext *)ctx_00->rt,JVar12);
          if ((((flags & 0x10U) == 0) || (iVar1 != 0)) && (((uint)flags >> (JVar7 & 0x1f) & 1) != 0)
             ) {
            local_88[local_b0 & 0xffffffff].atom = JVar12;
            local_88[local_b0 & 0xffffffff].is_enumerable = iVar1;
            local_b0 = (ulong)((int)local_b0 + 1);
          }
          else {
            JS_FreeAtom(ctx_00,JVar12);
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 < local_b4);
      }
      (*(ctx_00->rt->mf).js_free)(&ctx_00->rt->malloc_state,local_98);
      goto LAB_0011d95d;
    }
    if (((flags & 1U) == 0) || (*(int *)((long)local_a0.ptr + 0x38) != -7)) goto LAB_0011d95d;
    uVar9 = *(uint *)&(((anon_union_24_22_bbf4f0e3_for_u *)((long)local_a0.ptr + 0x30))->
                       async_function_data->header).field_0x4 & 0x7fffffff;
  }
  else {
    if ((flags & 1U) == 0) goto LAB_0011d95d;
    uVar9 = *(uint *)((long)local_a0.ptr + 0x40);
  }
  if (0 < (int)uVar9) {
    JVar12 = 0x80000000;
    do {
      local_88[local_c0].atom = JVar12;
      local_88[local_c0].is_enumerable = 1;
      local_c0 = (ulong)((int)local_c0 + 1);
      JVar12 = JVar12 + 1;
    } while( true );
  }
LAB_0011d95d:
  if (!(bool)(local_b8 == 0 | bVar18)) {
    rqsort(local_88,(ulong)local_b8,8,num_keys_cmp,ctx_00);
  }
  *local_78 = local_88;
  *local_70 = uVar13;
  return 0;
}

Assistant:

static int __exception JS_GetOwnPropertyNamesInternal(JSContext *ctx,
                                                      JSPropertyEnum **ptab,
                                                      uint32_t *plen,
                                                      JSObject *p, int flags)
{
    int i, j;
    JSShape *sh;
    JSShapeProperty *prs;
    JSPropertyEnum *tab_atom, *tab_exotic;
    JSAtom atom;
    uint32_t num_keys_count, str_keys_count, sym_keys_count, atom_count;
    uint32_t num_index, str_index, sym_index, exotic_count, exotic_keys_count;
    BOOL is_enumerable, num_sorted;
    uint32_t num_key;
    JSAtomKindEnum kind;
    
    /* clear pointer for consistency in case of failure */
    *ptab = NULL;
    *plen = 0;

    /* compute the number of returned properties */
    num_keys_count = 0;
    str_keys_count = 0;
    sym_keys_count = 0;
    exotic_keys_count = 0;
    exotic_count = 0;
    tab_exotic = NULL;
    sh = p->shape;
    for(i = 0, prs = get_shape_prop(sh); i < sh->prop_count; i++, prs++) {
        atom = prs->atom;
        if (atom != JS_ATOM_NULL) {
            is_enumerable = ((prs->flags & JS_PROP_ENUMERABLE) != 0);
            kind = JS_AtomGetKind(ctx, atom);
            if ((!(flags & JS_GPN_ENUM_ONLY) || is_enumerable) &&
                ((flags >> kind) & 1) != 0) {
                /* need to raise an exception in case of the module
                   name space (implicit GetOwnProperty) */
                if (unlikely((prs->flags & JS_PROP_TMASK) == JS_PROP_VARREF) &&
                    (flags & (JS_GPN_SET_ENUM | JS_GPN_ENUM_ONLY))) {
                    JSVarRef *var_ref = p->prop[i].u.var_ref;
                    if (unlikely(JS_IsUninitialized(*var_ref->pvalue))) {
                        JS_ThrowReferenceErrorUninitialized(ctx, prs->atom);
                        return -1;
                    }
                }
                if (JS_AtomIsArrayIndex(ctx, &num_key, atom)) {
                    num_keys_count++;
                } else if (kind == JS_ATOM_KIND_STRING) {
                    str_keys_count++;
                } else {
                    sym_keys_count++;
                }
            }
        }
    }

    if (p->is_exotic) {
        if (p->fast_array) {
            if (flags & JS_GPN_STRING_MASK) {
                num_keys_count += p->u.array.count;
            }
        } else if (p->class_id == JS_CLASS_STRING) {
            if (flags & JS_GPN_STRING_MASK) {
                num_keys_count += js_string_obj_get_length(ctx, JS_MKPTR(JS_TAG_OBJECT, p));
            }
        } else {
            const JSClassExoticMethods *em = ctx->rt->class_array[p->class_id].exotic;
            if (em && em->get_own_property_names) {
                if (em->get_own_property_names(ctx, &tab_exotic, &exotic_count,
                                               JS_MKPTR(JS_TAG_OBJECT, p)))
                    return -1;
                for(i = 0; i < exotic_count; i++) {
                    atom = tab_exotic[i].atom;
                    kind = JS_AtomGetKind(ctx, atom);
                    if (((flags >> kind) & 1) != 0) {
                        is_enumerable = FALSE;
                        if (flags & (JS_GPN_SET_ENUM | JS_GPN_ENUM_ONLY)) {
                            JSPropertyDescriptor desc;
                            int res;
                            /* set the "is_enumerable" field if necessary */
                            res = JS_GetOwnPropertyInternal(ctx, &desc, p, atom);
                            if (res < 0) {
                                js_free_prop_enum(ctx, tab_exotic, exotic_count);
                                return -1;
                            }
                            if (res) {
                                is_enumerable =
                                    ((desc.flags & JS_PROP_ENUMERABLE) != 0);
                                js_free_desc(ctx, &desc);
                            }
                            tab_exotic[i].is_enumerable = is_enumerable;
                        }
                        if (!(flags & JS_GPN_ENUM_ONLY) || is_enumerable) {
                            exotic_keys_count++;
                        }
                    }
                }
            }
        }
    }

    /* fill them */

    atom_count = num_keys_count + str_keys_count + sym_keys_count + exotic_keys_count;
    /* avoid allocating 0 bytes */
    tab_atom = js_malloc(ctx, sizeof(tab_atom[0]) * max_int(atom_count, 1));
    if (!tab_atom) {
        js_free_prop_enum(ctx, tab_exotic, exotic_count);
        return -1;
    }

    num_index = 0;
    str_index = num_keys_count;
    sym_index = str_index + str_keys_count;

    num_sorted = TRUE;
    sh = p->shape;
    for(i = 0, prs = get_shape_prop(sh); i < sh->prop_count; i++, prs++) {
        atom = prs->atom;
        if (atom != JS_ATOM_NULL) {
            is_enumerable = ((prs->flags & JS_PROP_ENUMERABLE) != 0);
            kind = JS_AtomGetKind(ctx, atom);
            if ((!(flags & JS_GPN_ENUM_ONLY) || is_enumerable) &&
                ((flags >> kind) & 1) != 0) {
                if (JS_AtomIsArrayIndex(ctx, &num_key, atom)) {
                    j = num_index++;
                    num_sorted = FALSE;
                } else if (kind == JS_ATOM_KIND_STRING) {
                    j = str_index++;
                } else {
                    j = sym_index++;
                }
                tab_atom[j].atom = JS_DupAtom(ctx, atom);
                tab_atom[j].is_enumerable = is_enumerable;
            }
        }
    }

    if (p->is_exotic) {
        int len;
        if (p->fast_array) {
            if (flags & JS_GPN_STRING_MASK) {
                len = p->u.array.count;
                goto add_array_keys;
            }
        } else if (p->class_id == JS_CLASS_STRING) {
            if (flags & JS_GPN_STRING_MASK) {
                len = js_string_obj_get_length(ctx, JS_MKPTR(JS_TAG_OBJECT, p));
            add_array_keys:
                for(i = 0; i < len; i++) {
                    tab_atom[num_index].atom = __JS_AtomFromUInt32(i);
                    if (tab_atom[num_index].atom == JS_ATOM_NULL) {
                        js_free_prop_enum(ctx, tab_atom, num_index);
                        return -1;
                    }
                    tab_atom[num_index].is_enumerable = TRUE;
                    num_index++;
                }
            }
        } else {
            /* Note: exotic keys are not reordered and comes after the object own properties. */
            for(i = 0; i < exotic_count; i++) {
                atom = tab_exotic[i].atom;
                is_enumerable = tab_exotic[i].is_enumerable;
                kind = JS_AtomGetKind(ctx, atom);
                if ((!(flags & JS_GPN_ENUM_ONLY) || is_enumerable) &&
                    ((flags >> kind) & 1) != 0) {
                    tab_atom[sym_index].atom = atom;
                    tab_atom[sym_index].is_enumerable = is_enumerable;
                    sym_index++;
                } else {
                    JS_FreeAtom(ctx, atom);
                }
            }
            js_free(ctx, tab_exotic);
        }
    }

    assert(num_index == num_keys_count);
    assert(str_index == num_keys_count + str_keys_count);
    assert(sym_index == atom_count);

    if (num_keys_count != 0 && !num_sorted) {
        rqsort(tab_atom, num_keys_count, sizeof(tab_atom[0]), num_keys_cmp,
               ctx);
    }
    *ptab = tab_atom;
    *plen = atom_count;
    return 0;
}